

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::
call_matcher<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<trompeloeil::wildcard>_>
::report_missed(call_matcher<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<trompeloeil::wildcard>_>
                *this,char *reason)

{
  char *name;
  pointer psVar1;
  size_t min_calls;
  size_t call_count;
  string local_38;
  char *local_18;
  char *reason_local;
  call_matcher<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<trompeloeil::wildcard>_>
  *this_local;
  
  this->reported = true;
  name = (this->
         super_call_matcher_base<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         ).name;
  local_18 = reason;
  reason_local = (char *)this;
  params_string<trompeloeil::wildcard>(&local_38,(tuple<trompeloeil::wildcard> *)&this->field_0x78);
  psVar1 = std::
           unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ::operator->(&this->sequences);
  min_calls = sequence_handler_base::get_min_calls(psVar1);
  psVar1 = std::
           unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ::operator->(&this->sequences);
  call_count = sequence_handler_base::get_calls(psVar1);
  report_unfulfilled(reason,name,&local_38,min_calls,call_count,
                     (this->
                     super_call_matcher_base<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     ).loc);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void
    report_missed(
      char const *reason)
    noexcept
    {
      reported = true;
      report_unfulfilled(
        reason,
        name,
        params_string(val),
        sequences->get_min_calls(),
        sequences->get_calls(),
        loc);
    }